

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disconnect_on_rescursive_signal.cpp
# Opt level: O0

int main(void)

{
  slot_base **this;
  __sighandler_t in_RDX;
  __sighandler_t __handler;
  int in_ESI;
  int *args;
  connection cVar1;
  int local_b0 [4];
  anon_class_16_2_94732039 local_a0;
  undefined1 local_90 [8];
  connection c;
  signal<void_(int)> s;
  
  this = &c.m_slot;
  obs::signal<void_(int)>::signal((signal<void_(int)> *)this,in_ESI,in_RDX);
  local_a0.c = (connection *)local_90;
  local_a0.s = (signal<void_(int)> *)this;
  cVar1 = obs::signal<void(int)>::connect<main::__0>((signal<void(int)> *)this,&local_a0);
  c.m_signal = (signal_base *)cVar1.m_slot;
  local_90 = (undefined1  [8])cVar1.m_signal;
  local_b0[0] = 5;
  args = local_b0;
  obs::signal<void(int)>::operator()((signal<void(int)> *)&c.m_slot,args);
  obs::signal<void_(int)>::~signal((signal<void_(int)> *)&c.m_slot,(int)args,__handler);
  return 0;
}

Assistant:

int main() {
  obs::signal<void(int)> s;     // We have to use "obs::" because ambiguous name from sys/signal.h on macOS?
  obs::connection c = s.connect(
    [&](int i){
      if (i > 0)
        s(i-1);
      else
        c.disconnect();
    });
  s(5);
}